

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecmult_multi(secp256k1_scratch *scratch,secp256k1_ecmult_multi_func ecmult_multi)

{
  size_t sVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  secp256k1_scalar *psVar9;
  long lVar10;
  secp256k1_scalar *psVar11;
  secp256k1_gej *r_00;
  secp256k1_ge *psVar12;
  ulong uVar13;
  ulong uVar14;
  secp256k1_gej *psVar15;
  secp256k1_gej *psVar16;
  secp256k1_strauss_point_state *psVar17;
  secp256k1_ge *psVar18;
  uint64_t *puVar19;
  secp256k1_strauss_point_state *psVar20;
  code *cb;
  secp256k1_scalar **cbdata;
  secp256k1_scalar **ppsVar21;
  long lVar22;
  byte bVar23;
  ecmult_multi_data data;
  secp256k1_scalar t1;
  secp256k1_scalar t0;
  secp256k1_gej t1p;
  secp256k1_gej r;
  secp256k1_gej ptgj;
  secp256k1_gej expected;
  secp256k1_gej r2;
  secp256k1_scalar tmp2;
  secp256k1_scalar tmp1;
  secp256k1_ge ptg;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_ge ptg_4;
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pt [32];
  size_t sStack_1f00;
  secp256k1_scalar *local_1ee0;
  secp256k1_ge *local_1ed8;
  ulong local_1ed0;
  ulong local_1ec8;
  ulong local_1ec0;
  ulong local_1eb8;
  ulong local_1eb0;
  ulong local_1ea8;
  secp256k1_scalar local_1ea0;
  secp256k1_scalar local_1e80;
  secp256k1_strauss_state local_1e60;
  secp256k1_gej local_1e48;
  undefined1 local_1db0 [152];
  secp256k1_gej local_1d18;
  secp256k1_gej local_1c80;
  secp256k1_scalar local_1be8;
  secp256k1_scalar local_1bc8;
  secp256k1_scalar local_1ba8;
  secp256k1_scalar local_1b88;
  secp256k1_scalar local_1b68 [28];
  secp256k1_gej local_17e8;
  secp256k1_scalar local_1750;
  secp256k1_scalar local_1730;
  secp256k1_gej local_1710;
  secp256k1_fe local_1678 [8];
  secp256k1_ge local_14f8 [8];
  secp256k1_ge local_11b0;
  secp256k1_strauss_point_state local_1148;
  secp256k1_ge local_d38;
  secp256k1_ge local_cd0 [31];
  
  bVar23 = 0;
  local_1ee0 = &local_1be8;
  cbdata = &local_1ee0;
  local_1ed8 = &local_d38;
  psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = ecmult_multi_callback;
  psVar11 = (secp256k1_scalar *)0x0;
  psVar15 = (secp256k1_gej *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                          (secp256k1_scalar *)0x0,ecmult_multi_callback,cbdata,0);
  if (iVar5 == 0) goto LAB_00150d47;
  if (0 < COUNT) {
    uVar7 = 0;
    do {
      ppsVar21 = &local_1ee0;
      testutil_random_scalar_order(&local_1be8);
      testutil_random_scalar_order(&local_1bc8);
      testutil_random_ge_test((secp256k1_ge *)&local_1710);
      secp256k1_gej_set_ge(&local_1d18,(secp256k1_ge *)&local_1710);
      local_1e48.x.n[2] = (uint64_t)&local_1148;
      psVar16 = &local_17e8;
      psVar15 = &local_1710;
      psVar12 = &local_d38;
      for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
        (psVar12->x).n[0] = (psVar15->x).n[0];
        psVar15 = (secp256k1_gej *)((long)psVar15 + (ulong)bVar23 * -0x10 + 8);
        psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      psVar12 = &secp256k1_ge_const_g;
      psVar18 = local_cd0;
      for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
        (psVar18->x).n[0] = (psVar12->x).n[0];
        psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar23 * -2 + 1) * 8);
        psVar18 = (secp256k1_ge *)((long)psVar18 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      local_1e48.x.n[0] = (uint64_t)local_1678;
      local_1e48.x.n[1] = (uint64_t)local_14f8;
      psVar9 = &local_1be8;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1e48,psVar16,1,&local_1d18,&secp256k1_scalar_zero
                 ,psVar9);
      psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      psVar15 = (secp256k1_gej *)scratch;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                              psVar9,ecmult_multi_callback,ppsVar21,0);
      if (iVar5 == 0) goto LAB_00150d06;
      psVar15 = psVar16;
      psVar17 = (secp256k1_strauss_point_state *)local_1db0;
      iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,psVar16);
      if (iVar5 == 0) goto LAB_00150d0b;
      local_1e48.x.n[0] = (uint64_t)local_1678;
      local_1e48.x.n[1] = (uint64_t)local_14f8;
      local_1e48.x.n[2] = (uint64_t)&local_1148;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1e48,psVar16,1,&local_1d18,&local_1be8,
                 &secp256k1_scalar_zero);
      psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      ppsVar21 = &local_1ee0;
      psVar9 = &secp256k1_scalar_zero;
      psVar15 = (secp256k1_gej *)scratch;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                              &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar21,1);
      if (iVar5 == 0) goto LAB_00150d10;
      psVar17 = (secp256k1_strauss_point_state *)local_1db0;
      iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,psVar16);
      if (iVar5 == 0) goto LAB_00150d15;
      psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_false_callback;
      cbdata = &local_1ee0;
      psVar9 = &secp256k1_scalar_zero;
      psVar16 = (secp256k1_gej *)scratch;
      ppsVar21 = cbdata;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                              &secp256k1_scalar_zero,ecmult_multi_false_callback,cbdata,1);
      if (iVar5 != 0) goto LAB_00150d1a;
      local_1e48.x.n[0] = (uint64_t)local_1678;
      local_1e48.x.n[1] = (uint64_t)local_14f8;
      local_1e48.x.n[2] = (uint64_t)&local_1148;
      psVar15 = &local_17e8;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1e48,psVar15,1,&local_1d18,&local_1be8,
                 &local_1bc8);
      psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      psVar9 = &secp256k1_scalar_zero;
      psVar16 = (secp256k1_gej *)scratch;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                              &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,2);
      if (iVar5 == 0) goto LAB_00150d1f;
      psVar16 = psVar15;
      psVar17 = (secp256k1_strauss_point_state *)local_1db0;
      iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,psVar15);
      if (iVar5 == 0) goto LAB_00150d24;
      local_1e48.x.n[0] = (uint64_t)local_1678;
      local_1e48.x.n[1] = (uint64_t)local_14f8;
      local_1e48.x.n[2] = (uint64_t)&local_1148;
      psVar9 = &local_1bc8;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1e48,psVar15,1,&local_1d18,&local_1be8,psVar9);
      psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cbdata = &local_1ee0;
      cb = ecmult_multi_callback;
      psVar16 = (secp256k1_gej *)scratch;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                              psVar9,ecmult_multi_callback,cbdata,1);
      if (iVar5 == 0) goto LAB_00150d29;
      psVar17 = (secp256k1_strauss_point_state *)local_1db0;
      iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,psVar15);
      psVar9 = (secp256k1_scalar *)(ulong)uVar7;
      if (iVar5 == 0) goto LAB_00150d2e;
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < COUNT);
    if (0 < COUNT) {
      uVar7 = 0;
      do {
        psVar11 = (secp256k1_scalar *)(ulong)uVar7;
        lVar8 = 0;
        do {
          psVar12 = &local_d38;
          lVar22 = 0;
          do {
            testutil_random_scalar_order((secp256k1_scalar *)((long)local_1be8.d + lVar22));
            secp256k1_ge_set_infinity(psVar12);
            lVar22 = lVar22 + 0x20;
            psVar12 = psVar12 + 1;
          } while (lVar22 != 0x400);
          psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar9 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar21 = &local_1ee0;
          psVar15 = (secp256k1_gej *)scratch;
          iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                                  &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar21,
                                  (&DAT_00175900)[lVar8]);
          if (iVar5 == 0) goto LAB_00150cde;
          psVar17 = (secp256k1_strauss_point_state *)local_1db0;
          secp256k1_gej_verify((secp256k1_gej *)local_1db0);
          if (local_1db0._144_4_ == 0) goto LAB_00150ce3;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lVar8 = 0;
        do {
          psVar9 = &local_1be8;
          lVar22 = 0;
          do {
            testutil_random_ge_test((secp256k1_ge *)&local_1148);
            psVar17 = &local_1148;
            puVar19 = (uint64_t *)((long)local_d38.x.n + lVar22);
            for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
              *puVar19 = ((secp256k1_fe *)psVar17->wnaf_na_1)->n[0];
              psVar17 = (secp256k1_strauss_point_state *)((long)psVar17 + (ulong)bVar23 * -0x10 + 8)
              ;
              puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
            }
            psVar9->d[2] = 0;
            psVar9->d[3] = 0;
            psVar9->d[0] = 0;
            psVar9->d[1] = 0;
            secp256k1_scalar_verify(psVar9);
            lVar22 = lVar22 + 0x68;
            psVar9 = psVar9 + 1;
          } while (lVar22 != 0xd00);
          psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar9 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar21 = &local_1ee0;
          psVar15 = (secp256k1_gej *)scratch;
          iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                                  &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar21,
                                  (&DAT_00175900)[lVar8]);
          if (iVar5 == 0) goto LAB_00150ce8;
          psVar17 = (secp256k1_strauss_point_state *)local_1db0;
          secp256k1_gej_verify((secp256k1_gej *)local_1db0);
          if (local_1db0._144_4_ == 0) goto LAB_00150ced;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lVar8 = 0;
        do {
          testutil_random_ge_test((secp256k1_ge *)&local_1148);
          lVar22 = 0x68;
          psVar9 = &local_1be8;
          do {
            testutil_random_scalar_order(psVar9);
            secp256k1_scalar_negate(psVar9 + 1,psVar9);
            psVar17 = &local_1148;
            puVar19 = (uint64_t *)((long)(&local_d38)[-1].x.n + lVar22);
            for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
              *puVar19 = ((secp256k1_fe *)psVar17->wnaf_na_1)->n[0];
              psVar17 = (secp256k1_strauss_point_state *)((long)psVar17 + (ulong)bVar23 * -0x10 + 8)
              ;
              puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
            }
            psVar17 = &local_1148;
            puVar19 = (uint64_t *)((long)local_d38.x.n + lVar22);
            for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
              *puVar19 = ((secp256k1_fe *)psVar17->wnaf_na_1)->n[0];
              psVar17 = (secp256k1_strauss_point_state *)((long)psVar17 + (ulong)bVar23 * -0x10 + 8)
              ;
              puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
            }
            lVar22 = lVar22 + 0xd0;
            psVar9 = psVar9 + 2;
          } while (lVar22 != 0xd68);
          psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          sVar1 = (&DAT_00175900)[lVar8];
          psVar9 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar21 = &local_1ee0;
          psVar15 = (secp256k1_gej *)scratch;
          iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                                  &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar21,sVar1);
          if (iVar5 == 0) goto LAB_00150cf2;
          psVar17 = (secp256k1_strauss_point_state *)local_1db0;
          secp256k1_gej_verify((secp256k1_gej *)local_1db0);
          if (local_1db0._144_4_ == 0) goto LAB_00150cf7;
          testutil_random_scalar_order(&local_1be8);
          lVar22 = 0x20;
          psVar12 = &local_d38;
          do {
            testutil_random_ge_test((secp256k1_ge *)&local_1148);
            uVar3 = local_1be8.d[3];
            uVar2 = local_1be8.d[1];
            *(uint64_t *)((long)local_1c80.z.n + lVar22 + 0x28) = local_1be8.d[2];
            *(uint64_t *)((long)(&local_1c80.z + 1) + lVar22) = uVar3;
            *(uint64_t *)((long)local_1c80.z.n + lVar22 + 0x18) = local_1be8.d[0];
            *(uint64_t *)((long)local_1c80.z.n + lVar22 + 0x20) = uVar2;
            *(uint64_t *)((long)local_1be8.d + lVar22) = local_1be8.d[0];
            *(uint64_t *)((long)local_1be8.d + lVar22 + 8) = local_1be8.d[1];
            *(uint64_t *)((long)local_1be8.d + lVar22 + 0x10) = local_1be8.d[2];
            *(uint64_t *)((long)local_1be8.d + lVar22 + 0x18) = local_1be8.d[3];
            psVar17 = &local_1148;
            psVar18 = psVar12;
            for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
              (psVar18->x).n[0] = ((secp256k1_fe *)psVar17->wnaf_na_1)->n[0];
              psVar17 = (secp256k1_strauss_point_state *)((long)psVar17 + (ulong)bVar23 * -0x10 + 8)
              ;
              psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar23 * -0x10 + 8);
            }
            secp256k1_ge_neg(psVar12 + 1,psVar12);
            lVar22 = lVar22 + 0x40;
            psVar12 = psVar12 + 2;
          } while (lVar22 != 0x420);
          psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar9 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar21 = &local_1ee0;
          psVar15 = (secp256k1_gej *)scratch;
          iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                                  &secp256k1_scalar_zero,ecmult_multi_callback,ppsVar21,sVar1);
          if (iVar5 == 0) goto LAB_00150cfc;
          psVar17 = (secp256k1_strauss_point_state *)local_1db0;
          secp256k1_gej_verify((secp256k1_gej *)local_1db0);
          if (local_1db0._144_4_ == 0) goto LAB_00150d01;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        testutil_random_ge_test((secp256k1_ge *)&local_1148);
        local_1be8.d[2] = 0;
        local_1be8.d[3] = 0;
        local_1be8.d[0] = 0;
        local_1be8.d[1] = 0;
        secp256k1_scalar_verify(&local_1be8);
        psVar17 = &local_1148;
        psVar12 = &local_d38;
        for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
          (psVar12->x).n[0] = ((secp256k1_fe *)psVar17->wnaf_na_1)->n[0];
          psVar17 = (secp256k1_strauss_point_state *)((long)psVar17 + (ulong)bVar23 * -0x10 + 8);
          psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar23 * -2 + 1) * 8);
        }
        lVar8 = 0x68;
        psVar9 = &local_1bc8;
        do {
          psVar17 = &local_1148;
          puVar19 = (uint64_t *)((long)local_d38.x.n + lVar8);
          for (lVar22 = 0xd; lVar22 != 0; lVar22 = lVar22 + -1) {
            *puVar19 = ((secp256k1_fe *)psVar17->wnaf_na_1)->n[0];
            psVar17 = (secp256k1_strauss_point_state *)((long)psVar17 + (ulong)bVar23 * -0x10 + 8);
            puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
          }
          testutil_random_scalar_order(psVar9);
          secp256k1_scalar_add(&local_1be8,&local_1be8,psVar9);
          secp256k1_scalar_negate(psVar9,psVar9);
          lVar8 = lVar8 + 0x68;
          psVar9 = psVar9 + 1;
        } while (lVar8 != 0xd00);
        psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar9 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        cbdata = &local_1ee0;
        psVar15 = (secp256k1_gej *)scratch;
        iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                                &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x20);
        if (iVar5 == 0) goto LAB_00150d33;
        psVar17 = (secp256k1_strauss_point_state *)local_1db0;
        secp256k1_gej_verify((secp256k1_gej *)local_1db0);
        if (local_1db0._144_4_ == 0) goto LAB_00150d38;
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < COUNT);
      if (0 < COUNT) {
        iVar5 = 0;
        do {
          secp256k1_gej_set_infinity((secp256k1_gej *)local_1db0);
          testutil_random_scalar_order(&local_1be8);
          psVar12 = &local_d38;
          lVar8 = 0;
          do {
            uVar4 = local_1be8.d[3];
            uVar3 = local_1be8.d[2];
            uVar2 = local_1be8.d[1];
            *(uint64_t *)((long)local_1be8.d + lVar8) = local_1be8.d[0];
            *(uint64_t *)((long)local_1be8.d + lVar8 + 8) = uVar2;
            *(uint64_t *)((long)local_1be8.d + lVar8 + 0x10) = uVar3;
            *(uint64_t *)((long)local_1be8.d + lVar8 + 0x18) = uVar4;
            testutil_random_ge_test((secp256k1_ge *)&local_1148);
            psVar17 = &local_1148;
            psVar18 = psVar12;
            for (lVar22 = 0xd; lVar22 != 0; lVar22 = lVar22 + -1) {
              (psVar18->x).n[0] = ((secp256k1_fe *)psVar17->wnaf_na_1)->n[0];
              psVar17 = (secp256k1_strauss_point_state *)((long)psVar17 + (ulong)bVar23 * -0x10 + 8)
              ;
              psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar23 * -0x10 + 8);
            }
            secp256k1_gej_add_ge_var
                      ((secp256k1_gej *)local_1db0,(secp256k1_gej *)local_1db0,psVar12,
                       (secp256k1_fe *)0x0);
            lVar8 = lVar8 + 0x20;
            psVar12 = psVar12 + 1;
          } while (lVar8 != 0x280);
          local_1d18.x.n[0] = (uint64_t)local_1678;
          local_1d18.x.n[1] = (uint64_t)local_14f8;
          local_1d18.x.n[2] = (uint64_t)&local_1148;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1d18,&local_17e8,1,
                     (secp256k1_gej *)local_1db0,&local_1be8,&secp256k1_scalar_zero);
          psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar11 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          cbdata = &local_1ee0;
          psVar15 = (secp256k1_gej *)scratch;
          iVar6 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)local_1db0,
                                  &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
          if (iVar6 == 0) goto LAB_00150d3d;
          psVar15 = &local_17e8;
          psVar17 = (secp256k1_strauss_point_state *)local_1db0;
          iVar6 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,&local_17e8);
          if (iVar6 == 0) goto LAB_00150d42;
          iVar5 = iVar5 + 1;
        } while (iVar5 < COUNT);
        if (0 < COUNT) {
          iVar5 = 0;
          do {
            local_1e48.x.n[2] = 0;
            local_1e48.x.n[3] = 0;
            local_1e48.x.n[0] = 0;
            local_1e48.x.n[1] = 0;
            secp256k1_scalar_verify((secp256k1_scalar *)&local_1e48);
            testutil_random_ge_test((secp256k1_ge *)&local_1710);
            psVar11 = &local_1be8;
            lVar8 = 0;
            do {
              testutil_random_scalar_order(psVar11);
              psVar15 = &local_1710;
              puVar19 = (uint64_t *)((long)local_d38.x.n + lVar8);
              for (lVar22 = 0xd; lVar22 != 0; lVar22 = lVar22 + -1) {
                *puVar19 = (psVar15->x).n[0];
                psVar15 = (secp256k1_gej *)((long)psVar15 + (ulong)bVar23 * -0x10 + 8);
                puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
              }
              secp256k1_scalar_add
                        ((secp256k1_scalar *)&local_1e48,(secp256k1_scalar *)&local_1e48,psVar11);
              lVar8 = lVar8 + 0x68;
              psVar11 = psVar11 + 1;
            } while (lVar8 != 0x820);
            secp256k1_gej_set_ge(&local_1d18,&local_d38);
            local_1c80.x.n[0] = (uint64_t)local_1678;
            local_1c80.x.n[1] = (uint64_t)local_14f8;
            local_1c80.x.n[2] = (uint64_t)&local_1148;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)&local_1c80,&local_17e8,1,&local_1d18,
                       (secp256k1_scalar *)&local_1e48,&secp256k1_scalar_zero);
            psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
            psVar20 = (secp256k1_strauss_point_state *)local_1db0;
            psVar11 = &secp256k1_scalar_zero;
            cb = ecmult_multi_callback;
            cbdata = &local_1ee0;
            psVar15 = (secp256k1_gej *)scratch;
            iVar6 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)psVar20,
                                    &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
            if (iVar6 == 0) goto LAB_00150d4c;
            psVar15 = &local_17e8;
            iVar6 = secp256k1_gej_eq_var((secp256k1_gej *)psVar20,psVar15);
            if (iVar6 == 0) goto LAB_00150d51;
            iVar5 = iVar5 + 1;
          } while (iVar5 < COUNT);
        }
      }
    }
  }
  lVar8 = 0;
  psVar12 = &local_d38;
  do {
    testutil_random_scalar_order((secp256k1_scalar *)((long)local_1be8.d + lVar8));
    testutil_random_ge_test(psVar12);
    psVar12 = psVar12 + 1;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0x280);
  local_1be8.d[2] = 0;
  local_1be8.d[3] = 0;
  local_1be8.d[0] = 0;
  local_1be8.d[1] = 0;
  secp256k1_scalar_verify(&local_1be8);
  psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar11 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1ee0;
  psVar15 = (secp256k1_gej *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar20,scratch,(secp256k1_gej *)local_1db0,
                          &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
  if (iVar5 == 0) goto LAB_00150d56;
  local_1bc8.d[2] = 0;
  local_1bc8.d[3] = 0;
  local_1bc8.d[0] = 0;
  local_1bc8.d[1] = 0;
  secp256k1_scalar_verify(&local_1bc8);
  local_1ba8.d[2] = 0;
  local_1ba8.d[3] = 0;
  local_1ba8.d[0] = 0;
  local_1ba8.d[1] = 0;
  secp256k1_scalar_verify(&local_1ba8);
  local_1b88.d[2] = 0;
  local_1b88.d[3] = 0;
  local_1b88.d[0] = 0;
  local_1b88.d[1] = 0;
  secp256k1_scalar_verify(&local_1b88);
  local_1b68[0].d[2] = 0;
  local_1b68[0].d[3] = 0;
  local_1b68[0].d[0] = 0;
  local_1b68[0].d[1] = 0;
  secp256k1_scalar_verify(local_1b68);
  psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar11 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1ee0;
  psVar15 = (secp256k1_gej *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar20,scratch,(secp256k1_gej *)local_1db0,
                          &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,6);
  if (iVar5 == 0) goto LAB_00150d5b;
  psVar20 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar11 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1ee0;
  psVar15 = (secp256k1_gej *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar20,scratch,(secp256k1_gej *)local_1db0,
                          &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,5);
  if (iVar5 != 0) {
    psVar20 = (secp256k1_strauss_point_state *)local_1db0;
    secp256k1_gej_verify((secp256k1_gej *)psVar20);
    if (local_1db0._144_4_ != 0) {
      testutil_random_ge_test(&local_11b0);
      secp256k1_gej_set_ge(&local_1d18,&local_11b0);
      local_1ed0 = 0;
      do {
        local_1ec8 = local_1ed0 + 1 >> 1;
        local_1ec0 = (ulong)((uint)local_1ed0 & 1);
        uVar13 = 0;
        local_1ed0 = local_1ed0 + 1;
        do {
          uVar14 = local_1ec0;
          local_1e80.d[3] = 0;
          local_1e80.d[1] = 0;
          local_1e80.d[2] = 0;
          local_1e80.d[0] = local_1ec8;
          secp256k1_scalar_verify(&local_1e80);
          secp256k1_scalar_cond_negate(&local_1e80,(int)uVar14);
          local_1eb8 = uVar13 + 1;
          local_1ea0.d[0] = local_1eb8 >> 1;
          local_1ea0.d[1] = 0;
          local_1ea0.d[2] = 0;
          local_1ea0.d[3] = 0;
          secp256k1_scalar_verify(&local_1ea0);
          secp256k1_scalar_cond_negate(&local_1ea0,(uint)uVar13 & 1);
          local_1e48.x.n[0] = (uint64_t)local_1678;
          local_1e48.x.n[1] = (uint64_t)local_14f8;
          local_1e48.x.n[2] = (uint64_t)&local_1148;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1e48,&local_1710,1,&local_1d18,&local_1e80,
                     &secp256k1_scalar_zero);
          local_1c80.x.n[0] = (uint64_t)local_1678;
          local_1c80.x.n[1] = (uint64_t)local_14f8;
          local_1c80.x.n[2] = (uint64_t)&local_1148;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1c80,&local_1e48,1,&local_1d18,&local_1ea0,
                     &secp256k1_scalar_zero);
          local_1eb0 = 0;
          do {
            local_1ea8 = local_1eb0 + 1 >> 1;
            uVar7 = (uint)local_1eb0;
            uVar13 = 0;
            local_1eb0 = local_1eb0 + 1;
            do {
              secp256k1_ge_set_gej(&local_d38,&local_1710);
              secp256k1_ge_set_gej(local_cd0,&local_1e48);
              local_1be8.d[0] = local_1ea8;
              local_1be8.d[3] = 0;
              local_1be8.d[1] = 0;
              local_1be8.d[2] = 0;
              secp256k1_scalar_verify(&local_1be8);
              secp256k1_scalar_cond_negate(&local_1be8,uVar7 & 1);
              uVar14 = uVar13 + 1;
              local_1bc8.d[0] = uVar14 >> 1;
              local_1bc8.d[1] = 0;
              local_1bc8.d[2] = 0;
              local_1bc8.d[3] = 0;
              secp256k1_scalar_verify(&local_1bc8);
              psVar16 = &local_1c80;
              secp256k1_scalar_cond_negate(&local_1bc8,(uint)uVar13 & 1);
              secp256k1_scalar_mul(&local_1730,&local_1e80,&local_1be8);
              secp256k1_scalar_mul(&local_1750,&local_1ea0,&local_1bc8);
              secp256k1_scalar_add(&local_1730,&local_1730,&local_1750);
              local_1e60.aux = local_1678;
              local_1e60.pre_a = local_14f8;
              psVar20 = &local_1148;
              local_1e60.ps = psVar20;
              secp256k1_ecmult_strauss_wnaf
                        (&local_1e60,psVar16,1,&local_1d18,&local_1730,&secp256k1_scalar_zero);
              psVar17 = (secp256k1_strauss_point_state *)&CTX->error_callback;
              psVar9 = &secp256k1_scalar_zero;
              cb = ecmult_multi_callback;
              ppsVar21 = &local_1ee0;
              psVar15 = (secp256k1_gej *)scratch;
              iVar5 = (*ecmult_multi)((secp256k1_callback *)psVar17,scratch,(secp256k1_gej *)psVar20
                                      ,&secp256k1_scalar_zero,ecmult_multi_callback,ppsVar21,2);
              if (iVar5 == 0) {
                test_ecmult_multi_cold_3();
LAB_00150cd9:
                test_ecmult_multi_cold_2();
                goto LAB_00150cde;
              }
              iVar5 = secp256k1_gej_eq_var((secp256k1_gej *)psVar20,psVar16);
              psVar15 = psVar16;
              psVar17 = psVar20;
              if (iVar5 == 0) goto LAB_00150cd9;
              uVar13 = uVar14;
            } while (uVar14 != 8);
          } while (local_1eb0 != 8);
          uVar13 = local_1eb8;
        } while (local_1eb8 != 8);
        if (local_1ed0 == 8) {
          return;
        }
      } while( true );
    }
    goto LAB_00150d65;
  }
  goto LAB_00150d60;
LAB_00150cde:
  test_ecmult_multi_cold_21();
LAB_00150ce3:
  test_ecmult_multi_cold_20();
LAB_00150ce8:
  test_ecmult_multi_cold_19();
LAB_00150ced:
  test_ecmult_multi_cold_18();
LAB_00150cf2:
  test_ecmult_multi_cold_17();
LAB_00150cf7:
  test_ecmult_multi_cold_16();
LAB_00150cfc:
  test_ecmult_multi_cold_15();
LAB_00150d01:
  test_ecmult_multi_cold_14();
LAB_00150d06:
  test_ecmult_multi_cold_29();
LAB_00150d0b:
  test_ecmult_multi_cold_28();
LAB_00150d10:
  psVar16 = psVar15;
  test_ecmult_multi_cold_27();
LAB_00150d15:
  test_ecmult_multi_cold_26();
LAB_00150d1a:
  cbdata = ppsVar21;
  test_ecmult_multi_cold_1();
LAB_00150d1f:
  test_ecmult_multi_cold_25();
LAB_00150d24:
  test_ecmult_multi_cold_24();
LAB_00150d29:
  psVar15 = psVar16;
  test_ecmult_multi_cold_23();
LAB_00150d2e:
  test_ecmult_multi_cold_22();
LAB_00150d33:
  psVar11 = psVar9;
  test_ecmult_multi_cold_13();
LAB_00150d38:
  test_ecmult_multi_cold_12();
LAB_00150d3d:
  test_ecmult_multi_cold_11();
LAB_00150d42:
  test_ecmult_multi_cold_10();
LAB_00150d47:
  test_ecmult_multi_cold_30();
LAB_00150d4c:
  psVar20 = psVar17;
  test_ecmult_multi_cold_9();
LAB_00150d51:
  test_ecmult_multi_cold_8();
LAB_00150d56:
  test_ecmult_multi_cold_7();
LAB_00150d5b:
  test_ecmult_multi_cold_6();
LAB_00150d60:
  test_ecmult_multi_cold_5();
LAB_00150d65:
  test_ecmult_multi_cold_4();
  secp256k1_ecmult_pippenger_batch
            ((secp256k1_callback *)psVar20,(secp256k1_scratch *)psVar15,r_00,psVar11,cb,cbdata,
             sStack_1f00,0);
  return;
}

Assistant:

static void test_ecmult_multi(secp256k1_scratch *scratch, secp256k1_ecmult_multi_func ecmult_multi) {
    int ncount;
    secp256k1_scalar sc[32];
    secp256k1_ge pt[32];
    secp256k1_gej r;
    secp256k1_gej r2;
    ecmult_multi_data data;

    data.sc = sc;
    data.pt = pt;

    /* No points to multiply */
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0));

    /* Check 1- and 2-point multiplies against ecmult */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        secp256k1_gej ptgj;
        testutil_random_scalar_order(&sc[0]);
        testutil_random_scalar_order(&sc[1]);

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);
        pt[0] = ptg;
        pt[1] = secp256k1_ge_const_g;

        /* only G scalar */
        secp256k1_ecmult(&r2, &ptgj, &secp256k1_scalar_zero, &sc[0]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 1-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* Try to multiply 1 point, but callback returns false */
        CHECK(!ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1));

        /* 2-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 2-point with G scalar */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check infinite outputs of various forms */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        size_t i, j;
        size_t sizes[] = { 2, 10, 32 };

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_scalar_order(&sc[i]);
                secp256k1_ge_set_infinity(&pt[i]);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_ge_test(&ptg);
                pt[i] = ptg;
                secp256k1_scalar_set_int(&sc[i], 0);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            testutil_random_ge_test(&ptg);
            for (i = 0; i < 16; i++) {
                testutil_random_scalar_order(&sc[2*i]);
                secp256k1_scalar_negate(&sc[2*i + 1], &sc[2*i]);
                pt[2 * i] = ptg;
                pt[2 * i + 1] = ptg;
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));

            testutil_random_scalar_order(&sc[0]);
            for (i = 0; i < 16; i++) {
                testutil_random_ge_test(&ptg);

                sc[2*i] = sc[0];
                sc[2*i+1] = sc[0];
                pt[2 * i] = ptg;
                secp256k1_ge_neg(&pt[2*i+1], &pt[2*i]);
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        testutil_random_ge_test(&ptg);
        secp256k1_scalar_set_int(&sc[0], 0);
        pt[0] = ptg;
        for (i = 1; i < 32; i++) {
            pt[i] = ptg;

            testutil_random_scalar_order(&sc[i]);
            secp256k1_scalar_add(&sc[0], &sc[0], &sc[i]);
            secp256k1_scalar_negate(&sc[i], &sc[i]);
        }

        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32));
        CHECK(secp256k1_gej_is_infinity(&r));
    }

    /* Check random points, constant scalar */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_gej_set_infinity(&r);

        testutil_random_scalar_order(&sc[0]);
        for (i = 0; i < 20; i++) {
            secp256k1_ge ptg;
            sc[i] = sc[0];
            testutil_random_ge_test(&ptg);
            pt[i] = ptg;
            secp256k1_gej_add_ge_var(&r, &r, &pt[i], NULL);
        }

        secp256k1_ecmult(&r2, &r, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check random scalars, constant point */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_ge ptg;
        secp256k1_gej p0j;
        secp256k1_scalar rs;
        secp256k1_scalar_set_int(&rs, 0);

        testutil_random_ge_test(&ptg);
        for (i = 0; i < 20; i++) {
            testutil_random_scalar_order(&sc[i]);
            pt[i] = ptg;
            secp256k1_scalar_add(&rs, &rs, &sc[i]);
        }

        secp256k1_gej_set_ge(&p0j, &pt[0]);
        secp256k1_ecmult(&r2, &p0j, &rs, &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Sanity check that zero scalars don't cause problems */
    for (ncount = 0; ncount < 20; ncount++) {
        testutil_random_scalar_order(&sc[ncount]);
        testutil_random_ge_test(&pt[ncount]);
    }

    secp256k1_scalar_set_int(&sc[0], 0);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
    secp256k1_scalar_set_int(&sc[1], 0);
    secp256k1_scalar_set_int(&sc[2], 0);
    secp256k1_scalar_set_int(&sc[3], 0);
    secp256k1_scalar_set_int(&sc[4], 0);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6));
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5));
    CHECK(secp256k1_gej_is_infinity(&r));

    /* Run through s0*(t0*P) + s1*(t1*P) exhaustively for many small values of s0, s1, t0, t1 */
    {
        const size_t TOP = 8;
        size_t s0i, s1i;
        size_t t0i, t1i;
        secp256k1_ge ptg;
        secp256k1_gej ptgj;

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);

        for(t0i = 0; t0i < TOP; t0i++) {
            for(t1i = 0; t1i < TOP; t1i++) {
                secp256k1_gej t0p, t1p;
                secp256k1_scalar t0, t1;

                secp256k1_scalar_set_int(&t0, (t0i + 1) / 2);
                secp256k1_scalar_cond_negate(&t0, t0i & 1);
                secp256k1_scalar_set_int(&t1, (t1i + 1) / 2);
                secp256k1_scalar_cond_negate(&t1, t1i & 1);

                secp256k1_ecmult(&t0p, &ptgj, &t0, &secp256k1_scalar_zero);
                secp256k1_ecmult(&t1p, &ptgj, &t1, &secp256k1_scalar_zero);

                for(s0i = 0; s0i < TOP; s0i++) {
                    for(s1i = 0; s1i < TOP; s1i++) {
                        secp256k1_scalar tmp1, tmp2;
                        secp256k1_gej expected, actual;

                        secp256k1_ge_set_gej(&pt[0], &t0p);
                        secp256k1_ge_set_gej(&pt[1], &t1p);

                        secp256k1_scalar_set_int(&sc[0], (s0i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[0], s0i & 1);
                        secp256k1_scalar_set_int(&sc[1], (s1i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[1], s1i & 1);

                        secp256k1_scalar_mul(&tmp1, &t0, &sc[0]);
                        secp256k1_scalar_mul(&tmp2, &t1, &sc[1]);
                        secp256k1_scalar_add(&tmp1, &tmp1, &tmp2);

                        secp256k1_ecmult(&expected, &ptgj, &tmp1, &secp256k1_scalar_zero);
                        CHECK(ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
                        CHECK(secp256k1_gej_eq_var(&actual, &expected));
                    }
                }
            }
        }
    }
}